

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::NumericConstant>>,std::tuple<mp::NumericConstant>>
               (tuple<testing::Matcher<mp::NumericConstant>_> *matchers,
               tuple<mp::NumericConstant> *values,ostream *os)

{
  NumericConstant x;
  bool bVar1;
  ostream *this;
  ostream *in_RDX;
  tuple<mp::NumericConstant> *in_RSI;
  tuple<testing::Matcher<mp::NumericConstant>_> *in_RDI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  StringMatchResultListener *in_stack_fffffffffffffdd8;
  StringMatchResultListener *in_stack_fffffffffffffde0;
  MatcherBase<mp::NumericConstant> *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  string local_208 [8];
  StringMatchResultListener *in_stack_fffffffffffffe00;
  
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::NumericConstant>>,std::tuple<mp::NumericConstant>>
            (in_RDI,in_RSI,in_RDX);
  std::get<0ul,testing::Matcher<mp::NumericConstant>>
            ((tuple<testing::Matcher<mp::NumericConstant>_> *)0x169569);
  Matcher<mp::NumericConstant>::Matcher
            ((Matcher<mp::NumericConstant> *)in_stack_fffffffffffffde0,
             (Matcher<mp::NumericConstant> *)in_stack_fffffffffffffdd8);
  std::get<0ul,mp::NumericConstant>((tuple<mp::NumericConstant> *)0x169586);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe00);
  x.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._7_1_ =
       in_stack_fffffffffffffdf7;
  x.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_7_ =
       in_stack_fffffffffffffdf0;
  bVar1 = MatcherBase<mp::NumericConstant>::MatchAndExplain
                    (in_stack_fffffffffffffde8,x,
                     &in_stack_fffffffffffffde0->super_MatchResultListener);
  if (!bVar1) {
    this = std::operator<<(in_RDX,"  Expected arg #");
    in_stack_fffffffffffffde0 = (StringMatchResultListener *)std::ostream::operator<<(this,0);
    std::operator<<((ostream *)in_stack_fffffffffffffde0,": ");
    std::get<0ul,testing::Matcher<mp::NumericConstant>>
              ((tuple<testing::Matcher<mp::NumericConstant>_> *)0x169625);
    MatcherBase<mp::NumericConstant>::DescribeTo
              ((MatcherBase<mp::NumericConstant> *)in_stack_fffffffffffffde0,
               (ostream *)in_stack_fffffffffffffdd8);
    std::operator<<(in_RDX,"\n           Actual: ");
    UniversalPrint<mp::NumericConstant>
              ((NumericConstant *)in_stack_fffffffffffffde0,(ostream *)in_stack_fffffffffffffdd8);
    StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffdd8);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffde0,(ostream *)in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_208);
    std::operator<<(in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffde0);
  Matcher<mp::NumericConstant>::~Matcher((Matcher<mp::NumericConstant> *)0x1696fc);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }